

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.h
# Opt level: O1

void __thiscall rcnb::encoder::encode(encoder *this,istream *istream_in,wostream *ostream_in)

{
  size_t length_in;
  char *plaintext_in;
  wchar_t *code_out;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  rcnb_init_encodestate(&this->_state);
  uVar3 = (ulong)this->_buffersize;
  uVar2 = uVar3;
  if ((long)uVar3 < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  uVar1 = uVar3 * 0xc;
  if ((long)uVar3 < 0) {
    uVar1 = 0xffffffffffffffff;
  }
  plaintext_in = (char *)operator_new__(uVar2);
  code_out = (wchar_t *)operator_new__(uVar1);
  do {
    std::istream::read((char *)istream_in,(long)plaintext_in);
    length_in = *(size_t *)(istream_in + 8);
    rcnb_encode_block(plaintext_in,length_in,code_out,&this->_state);
    std::wostream::write((wchar_t *)ostream_in,(long)code_out);
    if ((long)length_in < 1) break;
  } while (*(int *)(istream_in + *(long *)(*(long *)istream_in + -0x18) + 0x20) == 0);
  rcnb_encode_blockend(code_out,&this->_state);
  std::wostream::write((wchar_t *)ostream_in,(long)code_out);
  operator_delete__(code_out);
  operator_delete__(plaintext_in);
  return;
}

Assistant:

void encode(std::istream& istream_in, std::wostream& ostream_in)
    {
        initialize();

        const int N = _buffersize;
        char* plaintext = new char[N];
        auto code = new wchar_t[3 * N];
        long plainlength;
        long codelength;

        do {
            istream_in.read(plaintext, N);
            plainlength = istream_in.gcount();

            codelength = encode(plaintext, plainlength, code);
            ostream_in.write(code, codelength);
        } while (istream_in.good() && plainlength > 0);

        codelength = encode_end(code);
        ostream_in.write(code, codelength);

        delete[] code;
        delete[] plaintext;
    }